

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reliveapp.cpp
# Opt level: O0

void __thiscall relive::ReLiveApp::savePosition(ReLiveApp *this)

{
  bool bVar1;
  PlayerState PVar2;
  int iVar3;
  ulong uVar4;
  int64_t iVar5;
  string local_e0;
  reference local_c0;
  Station *station;
  iterator __end3;
  iterator __begin3;
  vector<relive::Station,_std::allocator<relive::Station>_> *__range3;
  undefined1 local_80 [8];
  string newPos;
  string local_50;
  undefined1 local_30 [8];
  string dbPosition;
  ReLiveApp *this_local;
  
  dbPosition.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&local_50);
  ReLiveDB::getConfigValue<std::__cxx11::string>
            ((string *)local_30,&this->_rdb,&Keys::play_position_abi_cxx11_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)local_80);
  PVar2 = Player::state(&this->_player);
  if ((PVar2 == eENDOFSTREAM) || (this->_activeTrack == 0)) {
    if (this->_activeStation != 0) {
      __end3 = std::vector<relive::Station,_std::allocator<relive::Station>_>::begin
                         (&this->_stations);
      station = (Station *)
                std::vector<relive::Station,_std::allocator<relive::Station>_>::end
                          (&this->_stations);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<relive::Station_*,_std::vector<relive::Station,_std::allocator<relive::Station>_>_>
                                         *)&station), bVar1) {
        local_c0 = __gnu_cxx::
                   __normal_iterator<relive::Station_*,_std::vector<relive::Station,_std::allocator<relive::Station>_>_>
                   ::operator*(&__end3);
        if (this->_activeStation == local_c0->_id) {
          Station::reLiveURL_abi_cxx11_(&local_e0,local_c0);
          std::__cxx11::string::operator=((string *)local_80,(string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        __gnu_cxx::
        __normal_iterator<relive::Station_*,_std::vector<relive::Station,_std::allocator<relive::Station>_>_>
        ::operator++(&__end3);
      }
    }
  }
  else {
    iVar3 = Player::playTime(&this->_player);
    Track::reLiveURL_abi_cxx11_((string *)&__range3,&this->_activeTrackInfo,(long)iVar3);
    std::__cxx11::string::operator=((string *)local_80,(string *)&__range3);
    std::__cxx11::string::~string((string *)&__range3);
  }
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_80), bVar1)) {
    ReLiveDB::setConfigValue<std::__cxx11::string>
              (&this->_rdb,&Keys::play_position_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  }
  iVar5 = currentTime();
  this->_lastSavepoint = iVar5;
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void ReLiveApp::savePosition()
{
    auto dbPosition = _rdb.getConfigValue(Keys::play_position, std::string());
    std::string newPos;
    if (_player.state() != PlayerState::eENDOFSTREAM && _activeTrack) {
        newPos = _activeTrackInfo.reLiveURL(_player.playTime());
    }
    else if (_activeStation) {
        for (const auto& station : _stations) {
            if (_activeStation == station._id) {
                newPos = station.reLiveURL();
            }
        }
    }
    if(!newPos.empty() && dbPosition != newPos) {
        _rdb.setConfigValue(Keys::play_position, newPos);
    }
    _lastSavepoint = currentTime();
}